

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ClockingBlockSymbol::serializeTo(ClockingBlockSymbol *this,ASTSerializer *serializer)

{
  TimingControl *__n;
  ClockingSkew CVar1;
  string_view name;
  string_view name_00;
  ClockingSkew skew;
  ClockingSkew local_20;
  
  __n = getEvent(this);
  ASTSerializer::write(serializer,5,"event",(size_t)__n);
  CVar1 = getDefaultInputSkew(this);
  local_20.delay = CVar1.delay;
  local_20.edge = CVar1.edge;
  if (local_20.edge != None || local_20.delay != (TimingControl *)0x0) {
    name._M_str = "defaultInputSkew";
    name._M_len = 0x10;
    ASTSerializer::writeProperty(serializer,name);
    ASTSerializer::startObject(serializer);
    ClockingSkew::serializeTo(&local_20,serializer);
    ASTSerializer::endObject(serializer);
  }
  CVar1 = getDefaultOutputSkew(this);
  local_20.delay = CVar1.delay;
  local_20.edge = CVar1.edge;
  if (local_20.edge != None || local_20.delay != (TimingControl *)0x0) {
    name_00._M_str = "defaultOutputSkew";
    name_00._M_len = 0x11;
    ASTSerializer::writeProperty(serializer,name_00);
    ASTSerializer::startObject(serializer);
    ClockingSkew::serializeTo(&local_20,serializer);
    ASTSerializer::endObject(serializer);
  }
  return;
}

Assistant:

void ClockingBlockSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("event", getEvent());

    if (auto skew = getDefaultInputSkew(); skew.hasValue()) {
        serializer.writeProperty("defaultInputSkew");
        serializer.startObject();
        skew.serializeTo(serializer);
        serializer.endObject();
    }

    if (auto skew = getDefaultOutputSkew(); skew.hasValue()) {
        serializer.writeProperty("defaultOutputSkew");
        serializer.startObject();
        skew.serializeTo(serializer);
        serializer.endObject();
    }
}